

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

char xSAT_SolverSearch(xSAT_Solver_t *s)

{
  iword *piVar1;
  xSAT_Watcher_t *pxVar2;
  char cVar3;
  xSAT_BQueue_t *pxVar4;
  xSAT_Heap_t *h;
  xSAT_BQueue_t *pxVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  xSAT_VecWatchList_t *pxVar9;
  bool bVar10;
  char in_AL;
  int t;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  Vec_Int_t *pVVar16;
  Vec_Int_t *pVVar17;
  uint *puVar18;
  xSAT_Watcher_t *pxVar19;
  char *pcVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  char *__file;
  uint uVar27;
  uint uVar28;
  int iVar29;
  char *__assertion;
  uint *puVar30;
  ulong uVar31;
  ulong uVar32;
  int local_64;
  
  (s->Stats).nStarts = (s->Stats).nStarts + 1;
  do {
    uVar11 = xSAT_SolverPropagate(s);
    if (uVar11 == 0xffffffff) {
      pxVar4 = s->bqLBD;
      if ((pxVar4->nCap != pxVar4->nSize) ||
         ((double)(pxVar4->nSum / (ulong)(long)pxVar4->nSize & 0xffffffff) * (s->Config).K <=
          (double)(s->nSumLBD / (float)(s->Stats).nConflicts))) {
        if (s->vTrailLim->nSize == 0) {
          xSAT_SolverSimplify(s);
        }
        lVar15 = (s->Stats).nConflicts;
        if (s->nConfBeforeReduce <= lVar15) {
          s->nRC1 = lVar15 / (long)s->nRC2 + 1;
          xSAT_SolverReduceDB(s);
          iVar12 = s->nRC2 + (s->Config).nIncReduce;
          s->nRC2 = iVar12;
          s->nConfBeforeReduce = iVar12 * (int)s->nRC1;
        }
        uVar14 = 0xffffffff;
        while( true ) {
          iVar12 = (int)uVar14;
          if (iVar12 != -1) {
            if ((iVar12 < 0) || (s->vAssigns->nSize <= iVar12)) goto LAB_008fab09;
            if (s->vAssigns->pArray[uVar14] == '\x03') goto LAB_008fa6c6;
          }
          h = s->hOrder;
          pVVar17 = h->vHeap;
          uVar11 = pVVar17->nSize;
          if ((ulong)uVar11 == 0) break;
          if ((int)uVar11 < 1) goto LAB_008fab28;
          puVar18 = (uint *)pVVar17->pArray;
          uVar24 = *puVar18;
          uVar14 = (ulong)uVar24;
          uVar11 = puVar18[(ulong)uVar11 - 1];
          *puVar18 = uVar11;
          if (pVVar17->nSize < 1) goto LAB_008fab28;
          if (((int)uVar11 < 0) || (pVVar16 = h->vIndices, pVVar16->nSize <= (int)uVar11))
          goto LAB_008fab66;
          piVar6 = pVVar16->pArray;
          piVar6[uVar11] = 0;
          if (((int)uVar24 < 0) || (pVVar16->nSize <= (int)uVar24)) goto LAB_008fab66;
          piVar6[uVar14] = -1;
          iVar12 = pVVar17->nSize;
          if (iVar12 < 1) {
LAB_008fab85:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
          }
          pVVar17->nSize = iVar12 + -1;
          if (2 < iVar12) {
            xSAT_HeapPercolateDown(h,0);
          }
        }
        uVar14 = 0xffffffff;
LAB_008fa6c6:
        iVar12 = (int)uVar14;
        if (iVar12 == -1) {
          in_AL = '\x01';
          bVar10 = false;
        }
        else {
          if ((iVar12 < 0) || (s->vPolarity->nSize <= iVar12)) {
LAB_008fab09:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          cVar3 = s->vPolarity->pArray[uVar14];
          if (s->vAssigns->nSize <= iVar12) goto LAB_008fab09;
          if (s->vAssigns->pArray[uVar14] != '\x03') {
            __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == VarX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                          ,0x166,"void xSAT_SolverNewDecision(xSAT_Solver_t *, int)");
          }
          piVar1 = &(s->Stats).nDecisions;
          *piVar1 = *piVar1 + 1;
          Vec_IntPush(s->vTrailLim,s->vTrail->nSize);
          xSAT_SolverEnqueue(s,(uint)(cVar3 != '\0') + iVar12 * 2,0xffffffff);
          bVar10 = true;
        }
      }
      else {
        pxVar4->nSize = 0;
        pxVar4->iFirst = 0;
        pxVar4->iEmpty = 0;
        pxVar4->nSum = 0;
        bVar10 = false;
        xSAT_SolverCancelUntil(s,0);
        in_AL = '\0';
      }
      if (bVar10) goto LAB_008faaed;
LAB_008fa751:
      bVar10 = false;
    }
    else {
      pVVar17 = s->vTrailLim;
      lVar15 = (s->Stats).nConflicts;
      (s->Stats).nConflicts = lVar15 + 1;
      iVar12 = pVVar17->nSize;
      if (iVar12 == 0) {
        in_AL = -1;
      }
      else {
        pVVar17 = s->vTrail;
        pxVar4 = s->bqTrail;
        uVar24 = pVVar17->nSize;
        if (pxVar4->nSize == pxVar4->nCap) {
          iVar21 = pxVar4->iFirst;
          if (iVar21 != pxVar4->iEmpty) goto LAB_008fac3a;
          pxVar4->nSum = pxVar4->nSum - (ulong)pxVar4->pData[iVar21];
          pxVar4->iFirst = (iVar21 + 1) % pxVar4->nCap;
        }
        else {
          pxVar4->nSize = pxVar4->nSize + 1;
        }
        uVar14 = pxVar4->nSum + (ulong)uVar24;
        pxVar4->nSum = uVar14;
        pxVar4->pData[pxVar4->iEmpty] = uVar24;
        iVar21 = pxVar4->iEmpty + 1;
        pxVar4->iEmpty = iVar21;
        if (iVar21 == pxVar4->nCap) {
          pxVar4->iFirst = 0;
          pxVar4->iEmpty = 0;
        }
        if ((((s->Config).nFirstBlockRestart <= lVar15) &&
            (pxVar5 = s->bqLBD, pxVar5->nCap == pxVar5->nSize)) &&
           ((double)(uVar14 / (ulong)(long)pxVar4->nSize & 0xffffffff) * (s->Config).R <
            (double)pVVar17->nSize)) {
          pxVar5->nSize = 0;
          pxVar5->iFirst = 0;
          pxVar5->iEmpty = 0;
          pxVar5->nSum = 0;
        }
        pVVar17 = s->vLearntClause;
        pVVar17->nSize = 0;
        piVar6 = s->vTrail->pArray;
        iVar22 = s->vTrail->nSize + -1;
        uVar24 = 0xfffffffe;
        Vec_IntPush(pVVar17,-2);
        iVar21 = 0;
        do {
          if (uVar11 == 0xffffffff) {
            __assert_fail("ConfCRef != CRefUndef",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                          ,0x22d,
                          "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                         );
          }
          puVar18 = s->pMemory->pData + (int)uVar11;
          if ((uVar24 != 0xfffffffe) && (puVar18[1] == 2)) {
            uVar11 = puVar18[2];
            uVar23 = (int)uVar11 >> 1;
            if ((int)uVar23 < 0) goto LAB_008fab09;
            iVar13 = s->vAssigns->nSize;
            if (iVar13 <= (int)uVar23) goto LAB_008fab09;
            pcVar20 = s->vAssigns->pArray;
            if ((uVar11 & 1 ^ (int)pcVar20[uVar23]) == 1) {
              uVar23 = puVar18[3];
              uVar27 = (int)uVar23 >> 1;
              if (((int)uVar27 < 0) || (iVar13 <= (int)uVar27)) goto LAB_008fab09;
              if ((uVar23 & 1) != (int)pcVar20[uVar27]) {
                __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                              ,0x233,
                              "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                             );
              }
              puVar18[2] = uVar23;
              puVar18[3] = uVar11;
            }
          }
          if (((*puVar18 & 1) != 0) &&
             (puVar18[(long)(int)puVar18[1] + 2] =
                   puVar18[(long)(int)puVar18[1] + 2] + s->nClaActInc,
             (int)puVar18[(long)(int)puVar18[1] + 2] < 0)) {
            pVVar16 = s->vLearnts;
            if (0 < pVVar16->nSize) {
              lVar15 = 0;
              do {
                puVar30 = s->pMemory->pData;
                puVar30 = puVar30 + (long)pVVar16->pArray[lVar15] +
                                    (long)(int)puVar30[(long)pVVar16->pArray[lVar15] + 1] + 2;
                *puVar30 = *puVar30 >> 0xe;
                lVar15 = lVar15 + 1;
                pVVar16 = s->vLearnts;
              } while (lVar15 < pVVar16->nSize);
            }
            iVar13 = s->nClaActInc >> 0xe;
            if (iVar13 < 0x401) {
              iVar13 = 0x400;
            }
            s->nClaActInc = iVar13;
          }
          if (0x2f < *puVar18 && (*puVar18 & 1) != 0) {
            s->nStamp = s->nStamp + 1;
            if ((int)puVar18[1] < 1) {
              iVar13 = 0;
            }
            else {
              pVVar16 = s->vLevels;
              lVar15 = 0;
              iVar13 = 0;
              do {
                uVar11 = (int)puVar18[lVar15 + 2] >> 1;
                if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
                iVar29 = pVVar16->pArray[uVar11];
                lVar25 = (long)iVar29;
                if ((lVar25 < 0) || (s->vStamp->nSize <= iVar29)) goto LAB_008fab28;
                piVar7 = s->vStamp->pArray;
                if (piVar7[lVar25] != s->nStamp) {
                  piVar7[lVar25] = s->nStamp;
                  iVar13 = iVar13 + 1;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < (int)puVar18[1]);
            }
            uVar11 = *puVar18 >> 4;
            if (iVar13 + 1U < uVar11) {
              if (uVar11 <= (s->Config).nLBDFrozenClause) {
                *puVar18 = *puVar18 & 0xfffffff7;
              }
              *puVar18 = *puVar18 & 0xf | iVar13 << 4;
            }
          }
          if ((int)(uint)(uVar24 != 0xfffffffe) < (int)puVar18[1]) {
            uVar14 = (ulong)(uVar24 != 0xfffffffe);
            do {
              uVar11 = (int)puVar18[uVar14 + 2] >> 1;
              if (((int)uVar11 < 0) || (s->vSeen->nSize <= (int)uVar11)) goto LAB_008fab09;
              pcVar20 = s->vSeen->pArray;
              if (pcVar20[uVar11] == '\0') {
                if (s->vLevels->nSize <= (int)uVar11) goto LAB_008fab28;
                if (0 < s->vLevels->pArray[uVar11]) {
                  pcVar20[uVar11] = '\x01';
                  pVVar16 = s->vActivity;
                  piVar8 = pVVar16->pArray;
                  piVar7 = piVar8 + uVar11;
                  *piVar7 = *piVar7 + s->nVarActInc;
                  if (*piVar7 < 0) {
                    if (0 < pVVar16->nSize) {
                      lVar15 = 0;
                      do {
                        puVar30 = (uint *)(piVar8 + lVar15);
                        *puVar30 = *puVar30 >> 0x13;
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < pVVar16->nSize);
                    }
                    iVar13 = s->nVarActInc >> 0x13;
                    if (iVar13 < 0x21) {
                      iVar13 = 0x20;
                    }
                    s->nVarActInc = iVar13;
                  }
                  pVVar16 = s->hOrder->vIndices;
                  if (((int)uVar11 < pVVar16->nSize) &&
                     (iVar13 = pVVar16->pArray[uVar11], -1 < iVar13)) {
                    xSAT_HeapPercolateUp(s->hOrder,iVar13);
                  }
                  if (s->vLevels->nSize <= (int)uVar11) goto LAB_008fab28;
                  if (s->vLevels->pArray[uVar11] < s->vTrailLim->nSize) {
                    uVar11 = puVar18[uVar14 + 2];
                    pVVar16 = pVVar17;
                  }
                  else {
                    if (s->vReasons->nSize <= (int)uVar11) goto LAB_008fab28;
                    iVar21 = iVar21 + 1;
                    lVar15 = (long)s->vReasons->pArray[uVar11];
                    if ((lVar15 == -1) || ((s->pMemory->pData[lVar15] & 1) == 0)) goto LAB_008fa02a;
                    pVVar16 = s->vLastDLevel;
                  }
                  Vec_IntPush(pVVar16,uVar11);
                }
              }
LAB_008fa02a:
              uVar14 = uVar14 + 1;
            } while ((int)uVar14 < (int)puVar18[1]);
          }
          puVar18 = (uint *)(piVar6 + iVar22);
          do {
            uVar24 = *puVar18;
            uVar23 = (int)uVar24 >> 1;
            if (((int)uVar23 < 0) || (s->vSeen->nSize <= (int)uVar23)) goto LAB_008fab09;
            pcVar20 = s->vSeen->pArray;
            puVar18 = puVar18 + -1;
            iVar22 = iVar22 + -1;
          } while (pcVar20[uVar23] == '\0');
          if (s->vReasons->nSize <= (int)uVar23) goto LAB_008fab28;
          uVar11 = s->vReasons->pArray[uVar23];
          pcVar20[uVar23] = '\0';
          bVar10 = 1 < iVar21;
          iVar21 = iVar21 + -1;
        } while (bVar10);
        puVar18 = (uint *)pVVar17->pArray;
        *puVar18 = uVar24 ^ 1;
        iVar21 = pVVar17->nSize;
        uVar11 = 0;
        if (1 < (long)iVar21) {
          uVar11 = 0;
          lVar15 = 1;
          do {
            uVar24 = (int)puVar18[lVar15] >> 1;
            if (((int)uVar24 < 0) || (s->vLevels->nSize <= (int)uVar24)) goto LAB_008fab28;
            uVar11 = uVar11 | 1 << (*(byte *)(s->vLevels->pArray + uVar24) & 0x1f);
            lVar15 = lVar15 + 1;
          } while (iVar21 != lVar15);
        }
        if (0 < iVar21) {
          pVVar16 = s->vTagged;
          lVar15 = 0;
          do {
            Vec_IntPush(pVVar16,pVVar17->pArray[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 < pVVar17->nSize);
        }
        iVar21 = pVVar17->nSize;
        local_64 = 1;
        if (1 < iVar21) {
          local_64 = 1;
          lVar15 = 1;
          do {
            uVar24 = (int)puVar18[lVar15] >> 1;
            if (((int)uVar24 < 0) || (s->vReasons->nSize <= (int)uVar24)) goto LAB_008fab28;
            if (s->vReasons->pArray[uVar24] == -1) {
LAB_008fa4e7:
              lVar25 = (long)local_64;
              local_64 = local_64 + 1;
              puVar18[lVar25] = puVar18[lVar15];
            }
            else {
              pVVar16 = s->vStack;
              uVar23 = s->vTagged->nSize;
              pVVar16->nSize = 0;
              Vec_IntPush(pVVar16,uVar24);
              pVVar16 = s->vStack;
              iVar21 = pVVar16->nSize;
              while (iVar21 != 0) {
                if (iVar21 < 1) goto LAB_008fab85;
                pVVar16->nSize = iVar21 - 1U;
                iVar21 = pVVar16->pArray[iVar21 - 1U];
                if (((long)iVar21 < 0) || (s->vReasons->nSize <= iVar21)) goto LAB_008fab28;
                iVar21 = s->vReasons->pArray[iVar21];
                if ((long)iVar21 == -1) {
                  puVar30 = (uint *)0x0;
                }
                else {
                  puVar30 = s->pMemory->pData + iVar21;
                }
                if (iVar21 == -1) {
                  __assertion = "(unsigned) Vec_IntEntry( s->vReasons, v ) != CRefUndef";
                  __file = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                  ;
                  pcVar20 = "int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)";
                  goto LAB_008fab3d;
                }
                if (puVar30[1] == 2) {
                  uVar24 = puVar30[2];
                  uVar27 = (int)uVar24 >> 1;
                  if ((int)uVar27 < 0) goto LAB_008fab09;
                  iVar21 = s->vAssigns->nSize;
                  if (iVar21 <= (int)uVar27) goto LAB_008fab09;
                  pcVar20 = s->vAssigns->pArray;
                  if ((uVar24 & 1 ^ (int)pcVar20[uVar27]) == 1) {
                    uVar27 = puVar30[3];
                    uVar28 = (int)uVar27 >> 1;
                    if (((int)uVar28 < 0) || (iVar21 <= (int)uVar28)) goto LAB_008fab09;
                    if ((uVar27 & 1) != (int)pcVar20[uVar28]) {
                      __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                                    ,0x1ac,
                                    "int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)");
                    }
                    puVar30[2] = uVar27;
                    puVar30[3] = uVar24;
                  }
                }
                if (1 < (int)puVar30[1]) {
                  iVar21 = 1;
                  do {
                    uVar24 = (int)puVar30[(long)iVar21 + 2] >> 1;
                    if (((int)uVar24 < 0) || (s->vSeen->nSize <= (int)uVar24)) goto LAB_008fab09;
                    bVar10 = true;
                    if (s->vSeen->pArray[uVar24] == '\0') {
                      if (s->vLevels->nSize <= (int)uVar24) goto LAB_008fab28;
                      uVar27 = s->vLevels->pArray[uVar24];
                      if (uVar27 != 0) {
                        if (s->vReasons->nSize <= (int)uVar24) goto LAB_008fab28;
                        if ((s->vReasons->pArray[uVar24] == -1) ||
                           ((uVar11 >> (uVar27 & 0x1f) & 1) == 0)) {
                          pVVar16 = s->vTagged;
                          iVar22 = pVVar16->nSize;
                          uVar14 = (ulong)uVar23;
                          if ((int)uVar23 < iVar22) {
                            if ((int)uVar23 < 0) goto LAB_008fab28;
                            do {
                              uVar24 = pVVar16->pArray[uVar14] >> 1;
                              if (((int)uVar24 < 0) || (s->vSeen->nSize <= (int)uVar24))
                              goto LAB_008fab47;
                              s->vSeen->pArray[uVar24] = '\0';
                              uVar14 = uVar14 + 1;
                              pVVar16 = s->vTagged;
                              iVar22 = pVVar16->nSize;
                            } while ((int)uVar14 < iVar22);
                          }
                          iVar21 = (int)uVar14;
                          if (iVar22 < (int)uVar23) goto LAB_008fabc3;
                          pVVar16->nSize = uVar23;
                          bVar10 = false;
                        }
                        else {
                          Vec_IntPush(s->vStack,uVar24);
                          Vec_IntPush(s->vTagged,puVar30[(long)iVar21 + 2]);
                          if (s->vSeen->nSize <= (int)uVar24) goto LAB_008fab47;
                          s->vSeen->pArray[uVar24] = '\x01';
                        }
                      }
                    }
                    if (!bVar10) goto LAB_008fa4e7;
                    iVar21 = iVar21 + 1;
                  } while (iVar21 < (int)puVar30[1]);
                }
                pVVar16 = s->vStack;
                iVar21 = pVVar16->nSize;
              }
            }
            lVar15 = lVar15 + 1;
            iVar21 = pVVar17->nSize;
          } while (lVar15 < iVar21);
        }
        if (iVar21 < local_64) {
LAB_008fabc3:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar17->nSize = local_64;
        if (local_64 < 0x1f) {
          s->nStamp = s->nStamp + 1;
          if (0 < local_64) {
            pVVar16 = s->vLevels;
            piVar6 = pVVar17->pArray;
            lVar15 = 0;
            iVar21 = 0;
            do {
              uVar11 = piVar6[lVar15] >> 1;
              if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
              iVar22 = pVVar16->pArray[uVar11];
              lVar25 = (long)iVar22;
              if ((lVar25 < 0) || (s->vStamp->nSize <= iVar22)) goto LAB_008fab28;
              piVar7 = s->vStamp->pArray;
              if (piVar7[lVar25] != s->nStamp) {
                piVar7[lVar25] = s->nStamp;
                iVar21 = iVar21 + 1;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < pVVar17->nSize);
            if (6 < iVar21) goto LAB_008fa7d2;
          }
          uVar14 = (long)(int)*puVar18 ^ 1;
          pxVar9 = s->vBinWatches;
          if (pxVar9->nCap <= (int)uVar14) {
            __assert_fail("iEntry < v->nCap",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                          ,0x106,
                          "xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
          }
          if (pxVar9->nSize <= (int)uVar14) {
            __assert_fail("iEntry < v->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                          ,0x107,
                          "xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
          }
          pxVar19 = pxVar9->pArray[uVar14].pArray;
          iVar21 = pxVar9->pArray[uVar14].nSize;
          s->nStamp = s->nStamp + 1;
          if (0 < pVVar17->nSize) {
            piVar6 = pVVar17->pArray;
            pVVar16 = s->vStamp;
            lVar15 = 0;
            do {
              uVar11 = piVar6[lVar15] >> 1;
              if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) {
LAB_008fab66:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pVVar16->pArray[uVar11] = s->nStamp;
              lVar15 = lVar15 + 1;
            } while (lVar15 < pVVar17->nSize);
          }
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          else {
            pxVar2 = pxVar19 + iVar21;
            pVVar16 = s->vStamp;
            iVar21 = 0;
            do {
              uVar11 = pxVar19->Blocker >> 1;
              if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
              piVar6 = pVVar16->pArray;
              if (piVar6[uVar11] == s->nStamp) {
                if (s->vAssigns->nSize <= (int)uVar11) goto LAB_008fab09;
                if ((pxVar19->Blocker & 1U) == (int)s->vAssigns->pArray[uVar11]) {
                  iVar21 = iVar21 + 1;
                  piVar6[uVar11] = s->nStamp - 1;
                }
              }
              pxVar19 = pxVar19 + 1;
            } while (pxVar19 < pxVar2);
          }
          if (0 < iVar21) {
            iVar22 = pVVar17->nSize - iVar21;
            if (1 < iVar22) {
              iVar13 = pVVar17->nSize + -1;
              pVVar16 = s->vStamp;
              iVar29 = 1;
              do {
                uVar11 = (int)puVar18[iVar29] >> 1;
                if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
                if (pVVar16->pArray[uVar11] != s->nStamp) {
                  uVar11 = puVar18[iVar13];
                  puVar18[iVar13] = puVar18[iVar29];
                  puVar18[iVar29] = uVar11;
                  iVar29 = iVar29 + -1;
                  iVar13 = iVar13 + -1;
                }
                iVar29 = iVar29 + 1;
                iVar22 = pVVar17->nSize - iVar21;
              } while (iVar29 < iVar22);
            }
            pVVar17->nSize = iVar22;
          }
        }
LAB_008fa7d2:
        piVar6 = pVVar17->pArray;
        uVar11 = pVVar17->nSize;
        uVar14 = 0;
        iVar21 = 0;
        if ((ulong)uVar11 != 1) {
          iVar21 = piVar6[1];
          uVar24 = iVar21 >> 1;
          if ((int)uVar24 < 0) goto LAB_008fab28;
          pVVar16 = s->vLevels;
          if (pVVar16->nSize <= (int)uVar24) goto LAB_008fab28;
          piVar7 = pVVar16->pArray;
          lVar15 = 1;
          if (2 < (int)uVar11) {
            iVar22 = piVar7[uVar24];
            uVar31 = 1;
            uVar32 = 2;
            do {
              uVar24 = piVar6[uVar32] >> 1;
              if (((int)uVar24 < 0) || (pVVar16->nSize <= (int)uVar24)) goto LAB_008fab28;
              if (iVar22 < piVar7[uVar24]) {
                uVar31 = uVar32 & 0xffffffff;
                iVar22 = piVar7[uVar24];
              }
              uVar32 = uVar32 + 1;
            } while (uVar11 != uVar32);
            lVar15 = (long)(int)uVar31;
          }
          piVar6[1] = piVar6[lVar15];
          piVar6[lVar15] = iVar21;
          uVar11 = piVar6[1] >> 1;
          if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
          iVar21 = piVar7[uVar11];
        }
        s->nStamp = s->nStamp + 1;
        if (0 < pVVar17->nSize) {
          pVVar16 = s->vLevels;
          lVar15 = 0;
          uVar14 = 0;
          do {
            uVar11 = piVar6[lVar15] >> 1;
            if (((int)uVar11 < 0) || (pVVar16->nSize <= (int)uVar11)) goto LAB_008fab28;
            iVar22 = pVVar16->pArray[uVar11];
            lVar25 = (long)iVar22;
            if ((lVar25 < 0) || (s->vStamp->nSize <= iVar22)) goto LAB_008fab28;
            piVar7 = s->vStamp->pArray;
            if (piVar7[lVar25] != s->nStamp) {
              piVar7[lVar25] = s->nStamp;
              uVar14 = (ulong)((int)uVar14 + 1);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pVVar17->nSize);
        }
        pVVar17 = s->vLastDLevel;
        if (0 < pVVar17->nSize) {
          lVar15 = 0;
          do {
            iVar22 = pVVar17->pArray[lVar15];
            lVar25 = (long)iVar22;
            if ((lVar25 < 0) || (s->vReasons->nSize <= iVar22)) goto LAB_008fab28;
            if (s->pMemory->pData[s->vReasons->pArray[lVar25]] >> 4 < (uint)uVar14) {
              pVVar17 = s->vActivity;
              piVar7 = pVVar17->pArray;
              piVar6 = piVar7 + lVar25;
              *piVar6 = *piVar6 + s->nVarActInc;
              if (*piVar6 < 0) {
                if (0 < pVVar17->nSize) {
                  lVar26 = 0;
                  do {
                    puVar18 = (uint *)(piVar7 + lVar26);
                    *puVar18 = *puVar18 >> 0x13;
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < pVVar17->nSize);
                }
                iVar13 = s->nVarActInc >> 0x13;
                if (iVar13 < 0x21) {
                  iVar13 = 0x20;
                }
                s->nVarActInc = iVar13;
              }
              pVVar17 = s->hOrder->vIndices;
              if ((iVar22 < pVVar17->nSize) && (iVar22 = pVVar17->pArray[lVar25], -1 < iVar22)) {
                xSAT_HeapPercolateUp(s->hOrder,iVar22);
              }
            }
            lVar15 = lVar15 + 1;
            pVVar17 = s->vLastDLevel;
          } while (lVar15 < pVVar17->nSize);
          pVVar17->nSize = 0;
        }
        pVVar17 = s->vTagged;
        if (0 < pVVar17->nSize) {
          lVar15 = 0;
          do {
            uVar11 = pVVar17->pArray[lVar15] >> 1;
            if (((int)uVar11 < 0) || (s->vSeen->nSize <= (int)uVar11)) {
LAB_008fab47:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
            }
            s->vSeen->pArray[uVar11] = '\0';
            lVar15 = lVar15 + 1;
            pVVar17 = s->vTagged;
          } while (lVar15 < pVVar17->nSize);
        }
        pVVar17->nSize = 0;
        s->nSumLBD = (float)uVar14 + s->nSumLBD;
        pxVar4 = s->bqLBD;
        if (pxVar4->nSize == pxVar4->nCap) {
          iVar22 = pxVar4->iFirst;
          if (iVar22 != pxVar4->iEmpty) {
LAB_008fac3a:
            __assert_fail("p->iFirst == p->iEmpty",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatBQueue.h"
                          ,99,"void xSAT_BQueuePush(xSAT_BQueue_t *, unsigned int)");
          }
          pxVar4->nSum = pxVar4->nSum - (ulong)pxVar4->pData[iVar22];
          pxVar4->iFirst = (iVar22 + 1) % pxVar4->nCap;
        }
        else {
          pxVar4->nSize = pxVar4->nSize + 1;
        }
        pxVar4->nSum = pxVar4->nSum + uVar14;
        pxVar4->pData[pxVar4->iEmpty] = (uint)uVar14;
        iVar22 = pxVar4->iEmpty + 1;
        pxVar4->iEmpty = iVar22;
        if (iVar22 == pxVar4->nCap) {
          pxVar4->iFirst = 0;
          pxVar4->iEmpty = 0;
        }
        xSAT_SolverCancelUntil(s,iVar21);
        uVar11 = 0xffffffff;
        if (s->vLearntClause->nSize != 1) {
          uVar11 = xSAT_SolverClaNew(s,s->vLearntClause,1);
        }
        if (s->vLearntClause->nSize < 1) {
LAB_008fab28:
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
          ;
          pcVar20 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_008fab3d:
          __assert_fail(__assertion,__file,0x1a9,pcVar20);
        }
        xSAT_SolverEnqueue(s,*s->vLearntClause->pArray,uVar11);
        s->nVarActInc = (s->nVarActInc >> 4) + s->nVarActInc;
        s->nClaActInc = (s->nClaActInc >> 10) + s->nClaActInc;
      }
      if (iVar12 == 0) goto LAB_008fa751;
LAB_008faaed:
      bVar10 = true;
    }
    if (!bVar10) {
      return in_AL;
    }
  } while( true );
}

Assistant:

char xSAT_SolverSearch( xSAT_Solver_t * s )
{
    iword conflictC  = 0;

    s->Stats.nStarts++;
    for (;;)
    {
        unsigned hConfl = xSAT_SolverPropagate( s );

        if ( hConfl != CRefUndef )
        {
            /* Conflict */
            int BacktrackLevel;
            unsigned nLBD;
            unsigned CRef;

            s->Stats.nConflicts++;
            conflictC++;

            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                return LBoolFalse;

            xSAT_BQueuePush( s->bqTrail, Vec_IntSize( s->vTrail ) );
            if ( s->Stats.nConflicts > s->Config.nFirstBlockRestart && xSAT_BQueueIsValid( s->bqLBD ) && ( Vec_IntSize( s->vTrail ) > ( s->Config.R * ( iword ) xSAT_BQueueAvg( s->bqTrail ) ) ) )
                xSAT_BQueueClean(s->bqLBD);

            Vec_IntClear( s->vLearntClause );
            xSAT_SolverAnalyze( s, hConfl, s->vLearntClause, &BacktrackLevel, &nLBD );

            s->nSumLBD += nLBD;
            xSAT_BQueuePush( s->bqLBD, nLBD );
            xSAT_SolverCancelUntil( s, BacktrackLevel );

            CRef = Vec_IntSize( s->vLearntClause ) == 1 ? CRefUndef : xSAT_SolverClaNew( s, s->vLearntClause , 1 );
            xSAT_SolverEnqueue( s, Vec_IntEntry( s->vLearntClause , 0 ), CRef );

            xSAT_SolverVarActDecay( s );
            xSAT_SolverClaActDecay( s );
        }
        else
        {
            /* No conflict */
            int NextVar;
            if ( xSAT_BQueueIsValid( s->bqLBD ) && ( ( ( iword )xSAT_BQueueAvg( s->bqLBD ) * s->Config.K ) > ( s->nSumLBD / s->Stats.nConflicts ) ) )
            {
                xSAT_BQueueClean( s->bqLBD );
                xSAT_SolverCancelUntil( s, 0 );
                return LBoolUndef;
            }

            // Simplify the set of problem clauses:
            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                xSAT_SolverSimplify( s );

            // Reduce the set of learnt clauses:
            if ( s->Stats.nConflicts >= s->nConfBeforeReduce )
            {
                s->nRC1 = ( s->Stats.nConflicts / s->nRC2 ) + 1;
                xSAT_SolverReduceDB(s);
                s->nRC2 += s->Config.nIncReduce;
                s->nConfBeforeReduce = s->nRC1 * s->nRC2;
            }

            // New variable decision:
            NextVar = xSAT_SolverDecide( s );

            if ( NextVar == VarUndef )
                return LBoolTrue;

            xSAT_SolverNewDecision( s, xSAT_Var2Lit( NextVar, ( int ) Vec_StrEntry( s->vPolarity, NextVar ) ) );
        }
    }

    return LBoolUndef; // cannot happen
}